

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void parse_chunk(LexState *ls)

{
  uint8_t *puVar1;
  BCPos *l1;
  ushort uVar2;
  BCLine line;
  BCLine BVar3;
  FuncState *pFVar4;
  BCInsLine *pBVar5;
  uint64_t uVar6;
  GCtab *pGVar7;
  uint3 uVar8;
  bool bVar9;
  uint uVar10;
  LexToken LVar11;
  BCPos BVar12;
  BCPos BVar13;
  BCPos list;
  BCPos BVar14;
  BCReg BVar15;
  BCReg BVar16;
  uint uVar17;
  VarInfo *pVVar18;
  GCstr *pGVar19;
  VarIndex *pVVar20;
  cTValue *pcVar21;
  BCIns ins;
  short sVar22;
  int iVar23;
  FuncState *pFVar24;
  LexState *ls_00;
  undefined4 uVar25;
  uint uVar26;
  ExpDesc e;
  anon_union_8_3_2ce71dea_for_u local_98;
  MSize local_90;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined8 local_80;
  ulong local_78;
  anon_union_8_3_2ce71dea_for_u local_70;
  MSize local_68;
  undefined1 local_64;
  byte local_63;
  BCLine local_54;
  FuncScope local_50;
  ulong local_40;
  FuncState *local_38;
  
  uVar10 = ls->level + 1;
  ls->level = uVar10;
  if (199 < uVar10) {
    lj_lex_error(ls,0,LJ_ERR_XLEVELS);
  }
  do {
    iVar23 = ls->tok;
    if ((iVar23 - 0x104U < 0x1e) && ((0x20020007U >> (iVar23 - 0x104U & 0x1f) & 1) != 0)) break;
    if (0x14 < iVar23 - 0x102U) {
      if (iVar23 != 0x11d) goto switchD_0011eecb_caseD_104;
      parse_label(ls);
      goto LAB_0011f804;
    }
    line = ls->linenumber;
    switch(iVar23) {
    case 0x102:
      lj_lex_next(ls);
      parse_break(ls);
      goto LAB_0011f9bc;
    case 0x103:
      lj_lex_next(ls);
      parse_block(ls);
      lex_match(ls,0x106,0x103,line);
      break;
    default:
switchD_0011eecb_caseD_104:
      pFVar24 = ls->fs;
      expr_primary(ls,(ExpDesc *)&local_98.s);
      if (local_90 == 0xd) {
        *(undefined1 *)((long)&pFVar24->bcbase[(ulong)local_98.sval & 0xffffffff].ins + 3) = 1;
      }
      else {
        local_80 = 0;
        parse_assignment(ls,(LHSVarList *)&local_98.s,1);
      }
      break;
    case 0x108:
      local_38 = ls->fs;
      local_50.nactvar = (uint8_t)local_38->nactvar;
      local_50.flags = '\x01';
      local_50.vstart = local_38->ls->vtop;
      local_50.prev = local_38->bl;
      local_38->bl = &local_50;
      lj_lex_next(ls);
      pGVar19 = lex_str(ls);
      iVar23 = ls->tok;
      if ((iVar23 == 0x2c) || (iVar23 == 0x10c)) {
        pFVar24 = ls->fs;
        local_40 = (ulong)pFVar24->pc;
        local_78 = (ulong)pFVar24->freereg;
        var_new(ls,0,(GCstr *)0x4);
        var_new(ls,1,(GCstr *)0x5);
        var_new(ls,2,(GCstr *)0x6);
        var_new(ls,3,pGVar19);
        uVar10 = 4;
        if (ls->tok == 0x2c) {
          BVar15 = 4;
          do {
            lj_lex_next(ls);
            uVar10 = BVar15 + 1;
            pGVar19 = lex_str(ls);
            var_new(ls,BVar15,pGVar19);
            BVar15 = uVar10;
          } while (ls->tok == 0x2c);
        }
        lex_check(ls,0x10c);
        BVar3 = ls->linenumber;
        BVar15 = expr_list(ls,(ExpDesc *)&local_98.s);
        assign_adjust(ls,3,BVar15,(ExpDesc *)&local_98.s);
        uVar17 = pFVar24->freereg + 4;
        if (pFVar24->framesize < uVar17) {
          if (0xf9 < uVar17) {
            err_syntax(pFVar24->ls,LJ_ERR_XSLOTS);
          }
          pFVar24->framesize = (uint8_t)uVar17;
        }
        local_54 = BVar3;
        if ((uVar10 < 6) && ((uint)local_40 < pFVar24->bclim)) {
          uVar17 = pFVar24->bcbase[local_40].ins;
          if ((char)uVar17 == '6') {
            pGVar7 = pFVar24->kt;
            pGVar19 = lj_str_new(ls->L,"pairs",5);
            pcVar21 = lj_tab_getstr(pGVar7,pGVar19);
            if (((pcVar21 == (cTValue *)0x0) || ((pcVar21->field_4).it != 0)) ||
               (uVar25 = (undefined4)CONCAT71((int7)((ulong)pGVar7 >> 8),1),
               (pcVar21->field_4).i != uVar17 >> 0x10)) {
              pGVar7 = pFVar24->kt;
              pGVar19 = lj_str_new(ls->L,"next",4);
              pcVar21 = lj_tab_getstr(pGVar7,pGVar19);
              if (((pcVar21 == (cTValue *)0x0) || ((pcVar21->field_4).it != 0)) ||
                 (uVar25 = (undefined4)CONCAT71((int7)((ulong)pGVar7 >> 8),1),
                 (pcVar21->field_4).i != uVar17 >> 0x10)) goto LAB_0011faab;
            }
          }
          else {
            if ((uVar17 & 0xff) == 0x2d) {
              pVVar20 = pFVar24->uvmap + (uVar17 >> 0x10);
            }
            else {
              if (((uVar17 & 0xff) != 0x12) || (pFVar24->nactvar <= uVar17 >> 0x10))
              goto LAB_0011faab;
              pVVar20 = pFVar24->varmap + (uVar17 >> 0x10);
            }
            uVar6 = ls->vstack[*pVVar20].name.gcptr64;
            iVar23 = *(int *)(uVar6 + 0x14);
            uVar8 = (uint3)((uint)iVar23 >> 8);
            if (iVar23 == 4) {
              iVar23 = strcmp((char *)(uVar6 + 0x18),"next");
              uVar25 = CONCAT31(uVar8,iVar23 == 0);
            }
            else {
              if ((iVar23 != 5) || (iVar23 = strcmp((char *)(uVar6 + 0x18),"pairs"), iVar23 != 0))
              goto LAB_0011faab;
              uVar25 = (undefined4)CONCAT71((uint7)uVar8,1);
            }
          }
        }
        else {
LAB_0011faab:
          uVar25 = 0;
        }
        pFVar4 = ls->fs;
        pVVar18 = ls->vstack;
        BVar14 = pFVar4->pc;
        uVar17 = pFVar4->nactvar;
        iVar23 = 3;
        do {
          uVar2 = pFVar4->varmap[uVar17];
          pVVar18[uVar2].startpc = BVar14;
          pVVar18[uVar2].slot = (uint8_t)uVar17;
          uVar17 = uVar17 + 1;
          pVVar18[uVar2].info = '\0';
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
        pFVar4->nactvar = uVar17;
        lex_check(ls,0x103);
        iVar23 = (int)local_78 * 0x100;
        local_78 = CONCAT44(local_78._4_4_,uVar25);
        BVar14 = bcemit_INS(pFVar24,(uint)(byte)((byte)uVar25 ^ 1) * 0x10 + iVar23 + 0x300 |
                                    0x7fff0048);
        local_64 = (undefined1)pFVar24->nactvar;
        local_63 = 0;
        local_68 = pFVar24->ls->vtop;
        local_70 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
        pFVar24->bl = (FuncScope *)&local_70;
        pFVar4 = ls->fs;
        uVar17 = pFVar4->nactvar;
        BVar15 = uVar10 - 3;
        if (BVar15 != 0) {
          pVVar18 = ls->vstack;
          BVar12 = pFVar4->pc;
          uVar26 = uVar17;
          BVar16 = BVar15;
          do {
            uVar17 = uVar26 + 1;
            uVar2 = pFVar4->varmap[uVar26];
            pVVar18[uVar2].startpc = BVar12;
            pVVar18[uVar2].slot = (uint8_t)uVar26;
            pVVar18[uVar2].info = '\0';
            BVar16 = BVar16 - 1;
            uVar26 = uVar17;
          } while (BVar16 != 0);
        }
        pFVar4->nactvar = uVar17;
        bcreg_reserve(pFVar24,BVar15);
        parse_block(ls);
        fscope_end(pFVar24);
        uVar17 = (pFVar24->pc - BVar14) + 0x7fff;
        if (uVar17 < 0x10000) {
          uVar26 = iVar23 + 0x300;
          *(short *)((long)&pFVar24->bcbase[BVar14].ins + 2) = (short)uVar17;
          bcemit_INS(pFVar24,(uint)(byte)local_78 + uVar10 * 0x1000000 + 0xfe000045 | uVar26 |
                             0x30000);
          BVar12 = bcemit_INS(pFVar24,uVar26 | 0x7fff0052);
          pBVar5 = pFVar24->bcbase;
          pBVar5[BVar12 - 1].line = local_54;
          pBVar5[BVar12].line = local_54;
          sVar22 = (short)(BVar14 - BVar12);
          if ((int)sVar22 == BVar14 - BVar12) {
            *(short *)((long)&pBVar5[BVar12].ins + 2) = sVar22 + -0x8000;
            goto LAB_0011fc56;
          }
        }
      }
      else {
        if (iVar23 != 0x3d) {
          err_syntax(ls,LJ_ERR_XFOR);
        }
        pFVar24 = ls->fs;
        BVar15 = pFVar24->freereg;
        var_new(ls,0,(GCstr *)0x1);
        var_new(ls,1,(GCstr *)0x2);
        var_new(ls,2,(GCstr *)0x3);
        var_new(ls,3,pGVar19);
        lex_check(ls,0x3d);
        expr_binop(ls,(ExpDesc *)&local_98.s,0);
        expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        lex_check(ls,0x2c);
        expr_binop(ls,(ExpDesc *)&local_98.s,0);
        expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        if (ls->tok == 0x2c) {
          lj_lex_next(ls);
          expr_binop(ls,(ExpDesc *)&local_98.s,0);
          expr_tonextreg(ls->fs,(ExpDesc *)&local_98.s);
        }
        else {
          bcemit_INS(pFVar24,pFVar24->freereg << 8 | 0x10029);
          bcreg_reserve(pFVar24,1);
        }
        pFVar4 = ls->fs;
        pVVar18 = ls->vstack;
        BVar14 = pFVar4->pc;
        uVar10 = pFVar4->nactvar;
        iVar23 = 3;
        do {
          uVar2 = pFVar4->varmap[uVar10];
          pVVar18[uVar2].startpc = BVar14;
          pVVar18[uVar2].slot = (uint8_t)uVar10;
          uVar10 = uVar10 + 1;
          pVVar18[uVar2].info = '\0';
          iVar23 = iVar23 + -1;
        } while (iVar23 != 0);
        pFVar4->nactvar = uVar10;
        lex_check(ls,0x103);
        uVar17 = BVar15 << 8;
        BVar14 = bcemit_INS(pFVar24,uVar17 | 0x7fff004d);
        local_8c = (undefined1)pFVar24->nactvar;
        local_8b = 0;
        local_90 = pFVar24->ls->vtop;
        local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
        pFVar24->bl = (FuncScope *)&local_98;
        pFVar4 = ls->fs;
        pVVar18 = ls->vstack;
        uVar10 = pFVar4->nactvar;
        uVar2 = pFVar4->varmap[uVar10];
        pVVar18[uVar2].startpc = pFVar4->pc;
        pVVar18[uVar2].slot = (uint8_t)uVar10;
        pVVar18[uVar2].info = '\0';
        pFVar4->nactvar = uVar10 + 1;
        bcreg_reserve(pFVar24,1);
        parse_block(ls);
        fscope_end(pFVar24);
        BVar12 = bcemit_INS(pFVar24,uVar17 | 0x7fff004f);
        pBVar5 = pFVar24->bcbase;
        pBVar5[BVar12].line = line;
        sVar22 = (short)(BVar14 - BVar12);
        if ((int)sVar22 == BVar14 - BVar12) {
          *(short *)((long)&pBVar5[BVar12].ins + 2) = sVar22 + -0x8000;
          uVar10 = (pFVar24->pc - BVar14) + 0x7fff;
          if (uVar10 < 0x10000) {
            *(short *)((long)&pBVar5[BVar14].ins + 2) = (short)uVar10;
LAB_0011fc56:
            lex_match(ls,0x106,0x108,line);
            pFVar24 = local_38;
            goto LAB_0011fc72;
          }
        }
      }
      ls_00 = pFVar24->ls;
      goto LAB_0011fcdc;
    case 0x109:
      lj_lex_next(ls);
      pFVar24 = ls->fs;
      pGVar19 = lex_str(ls);
      var_lookup_(pFVar24,pGVar19,(ExpDesc *)&local_98.s,1);
      while (iVar23 = ls->tok, iVar23 == 0x2e) {
        expr_field(ls,(ExpDesc *)&local_98.s);
      }
      if (iVar23 == 0x3a) {
        expr_field(ls,(ExpDesc *)&local_98.s);
      }
      parse_body(ls,(ExpDesc *)&local_70.s,(uint)(iVar23 == 0x3a),line);
      pFVar24 = ls->fs;
      bcemit_store(pFVar24,(ExpDesc *)&local_98.s,(ExpDesc *)&local_70.s);
      pFVar24->bcbase[pFVar24->pc - 1].line = line;
      break;
    case 0x10a:
      LVar11 = lj_lex_lookahead(ls);
      if (LVar11 != 0x11f) goto switchD_0011eecb_caseD_104;
      lj_lex_next(ls);
      pFVar24 = ls->fs;
      pGVar19 = lex_str(ls);
      pVVar18 = gola_findlabel(ls,pGVar19);
      if (pVVar18 != (VarInfo *)0x0) {
        bcemit_INS(pFVar24,(uint)pVVar18->slot << 8 | 0x7fff0055);
      }
      puVar1 = &pFVar24->bl->flags;
      *puVar1 = *puVar1 | 4;
      BVar14 = bcemit_jmp(pFVar24);
      gola_new(ls,pGVar19,'\x02',BVar14);
      break;
    case 0x10b:
      pFVar24 = ls->fs;
      local_98.s.info = 0xffffffff;
      BVar14 = parse_then(ls);
      l1 = &pFVar24->jpc;
      while (ls->tok == 0x105) {
        BVar12 = bcemit_jmp(pFVar24);
        jmp_append(pFVar24,(BCPos *)&local_98,BVar12);
        pFVar24->lasttarget = pFVar24->pc;
        jmp_append(pFVar24,l1,BVar14);
        BVar14 = parse_then(ls);
      }
      if (ls->tok == 0x104) {
        BVar12 = bcemit_jmp(pFVar24);
        jmp_append(pFVar24,(BCPos *)&local_98,BVar12);
        pFVar24->lasttarget = pFVar24->pc;
        jmp_append(pFVar24,l1,BVar14);
        lj_lex_next(ls);
        parse_block(ls);
      }
      else {
        jmp_append(pFVar24,(BCPos *)&local_98,BVar14);
      }
      pFVar24->lasttarget = pFVar24->pc;
      jmp_append(pFVar24,l1,local_98.s.info);
      lex_match(ls,0x106,0x10b,line);
      goto LAB_0011fc7a;
    case 0x10d:
      lj_lex_next(ls);
      if (ls->tok == 0x109) {
        lj_lex_next(ls);
        pFVar24 = ls->fs;
        pGVar19 = lex_str(ls);
        var_new(ls,0,pGVar19);
        BVar15 = pFVar24->freereg;
        bcreg_reserve(pFVar24,1);
        pFVar4 = ls->fs;
        pVVar18 = ls->vstack;
        uVar10 = pFVar4->nactvar;
        uVar2 = pFVar4->varmap[uVar10];
        pVVar18[uVar2].startpc = pFVar4->pc;
        pVVar18[uVar2].slot = (uint8_t)uVar10;
        pVVar18[uVar2].info = '\0';
        pFVar4->nactvar = uVar10 + 1;
        parse_body(ls,(ExpDesc *)&local_98.s,0,ls->linenumber);
        if ((local_90 == 0xc) && (pFVar24->nactvar <= local_98.s.info)) {
          pFVar24->freereg = pFVar24->freereg - 1;
        }
        expr_toreg(pFVar24,(ExpDesc *)&local_98.s,BVar15);
        ls->vstack[pFVar24->varmap[pFVar24->nactvar - 1]].startpc = pFVar24->pc;
      }
      else {
        pGVar19 = lex_str(ls);
        var_new(ls,0,pGVar19);
        BVar15 = 1;
        if (ls->tok == 0x2c) {
          BVar16 = 1;
          do {
            lj_lex_next(ls);
            BVar15 = BVar16 + 1;
            pGVar19 = lex_str(ls);
            var_new(ls,BVar16,pGVar19);
            BVar16 = BVar15;
          } while (ls->tok == 0x2c);
        }
        if (ls->tok == 0x3d) {
          lj_lex_next(ls);
          BVar16 = expr_list(ls,(ExpDesc *)&local_98.s);
        }
        else {
          local_90 = 0xe;
          BVar16 = 0;
        }
        assign_adjust(ls,BVar15,BVar16,(ExpDesc *)&local_98.s);
        pFVar24 = ls->fs;
        uVar10 = pFVar24->nactvar;
        if (BVar15 != 0) {
          pVVar18 = ls->vstack;
          BVar14 = pFVar24->pc;
          uVar17 = uVar10;
          do {
            uVar10 = uVar17 + 1;
            uVar2 = pFVar24->varmap[uVar17];
            pVVar18[uVar2].startpc = BVar14;
            pVVar18[uVar2].slot = (uint8_t)uVar17;
            pVVar18[uVar2].info = '\0';
            BVar15 = BVar15 - 1;
            uVar17 = uVar10;
          } while (BVar15 != 0);
        }
        pFVar24->nactvar = uVar10;
      }
      break;
    case 0x111:
      pFVar24 = ls->fs;
      uVar10 = pFVar24->pc;
      pFVar24->lasttarget = uVar10;
      local_8c = (undefined1)pFVar24->nactvar;
      local_8b = 1;
      local_90 = pFVar24->ls->vtop;
      local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
      pFVar24->bl = (FuncScope *)&local_98;
      local_63 = 0;
      pFVar24->bl = (FuncScope *)&local_70;
      local_70.sval = (GCstr *)&local_98;
      local_68 = local_90;
      local_64 = local_8c;
      lj_lex_next(ls);
      bcemit_INS(pFVar24,pFVar24->nactvar << 8 | 0x55);
      parse_chunk(ls);
      lex_match(ls,0x115,0x111,line);
      BVar14 = expr_cond(ls);
      if ((local_63 & 8) == 0) {
        fscope_end(pFVar24);
      }
      else {
        parse_break(ls);
        pFVar24->lasttarget = pFVar24->pc;
        jmp_append(pFVar24,&pFVar24->jpc,BVar14);
        fscope_end(pFVar24);
        BVar14 = bcemit_jmp(pFVar24);
      }
      jmp_patch(pFVar24,BVar14,uVar10);
      uVar17 = (pFVar24->pc - uVar10) + 0x7fff;
      if (0xffff < uVar17) {
LAB_0011fcd1:
        ls_00 = pFVar24->ls;
LAB_0011fcdc:
        err_syntax(ls_00,LJ_ERR_XJUMP);
      }
      *(short *)((long)&pFVar24->bcbase[uVar10].ins + 2) = (short)uVar17;
LAB_0011fc72:
      fscope_end(pFVar24);
      goto LAB_0011fc7a;
    case 0x112:
      pFVar24 = ls->fs;
      lj_lex_next(ls);
      pFVar24->flags = pFVar24->flags | 0x20;
      uVar10 = ls->tok - 0x104;
      ins = 0x1004b;
      if ((ls->tok != 0x3b) && ((uVar10 < 0x1e & (byte)(0x20020007 >> ((byte)uVar10 & 0x1f))) == 0))
      {
        BVar15 = expr_list(ls,(ExpDesc *)&local_98.s);
        if (BVar15 == 1) {
          if (local_90 == 0xd) {
            if ((char)pFVar24->bcbase[(ulong)local_98.sval & 0xffffffff].ins == 'G')
            goto LAB_0011f7d9;
            pFVar24->pc = pFVar24->pc - 1;
            uVar10 = pFVar24->bcbase[(ulong)local_98.sval & 0xffffffff].ins;
            ins = uVar10 & 0xffff00 | (uVar10 & 0xff) + 2;
          }
          else {
            BVar15 = expr_toanyreg(pFVar24,(ExpDesc *)&local_98.s);
            ins = BVar15 << 8 | 0x2004c;
          }
        }
        else if (local_90 == 0xd) {
LAB_0011f7d9:
          *(undefined1 *)((long)&pFVar24->bcbase[(ulong)local_98.sval & 0xffffffff].ins + 3) = 0;
          ins = (local_98.s.aux - pFVar24->nactvar) * 0x10000 | pFVar24->nactvar << 8 | 0x49;
        }
        else {
          expr_tonextreg(pFVar24,(ExpDesc *)&local_98.s);
          ins = BVar15 * 0x10000 + 0x1004a | pFVar24->nactvar << 8;
        }
      }
      if ((pFVar24->flags & 1) != 0) {
        bcemit_INS(pFVar24,0x80000032);
      }
      bcemit_INS(pFVar24,ins);
LAB_0011f9bc:
      bVar9 = false;
      goto LAB_0011fc81;
    case 0x116:
      pFVar24 = ls->fs;
      lj_lex_next(ls);
      BVar14 = pFVar24->pc;
      pFVar24->lasttarget = BVar14;
      BVar12 = expr_cond(ls);
      local_8c = (undefined1)pFVar24->nactvar;
      local_8b = 1;
      local_90 = pFVar24->ls->vtop;
      local_98 = (anon_union_8_3_2ce71dea_for_u)pFVar24->bl;
      pFVar24->bl = (FuncScope *)&local_98;
      lex_check(ls,0x103);
      BVar13 = bcemit_INS(pFVar24,pFVar24->nactvar << 8 | 0x55);
      parse_block(ls);
      list = bcemit_jmp(pFVar24);
      jmp_patch(pFVar24,list,BVar14);
      lex_match(ls,0x106,0x116,line);
      fscope_end(pFVar24);
      pFVar24->lasttarget = pFVar24->pc;
      jmp_append(pFVar24,&pFVar24->jpc,BVar12);
      uVar10 = (pFVar24->pc - BVar13) + 0x7fff;
      if (0xffff < uVar10) goto LAB_0011fcd1;
      *(short *)((long)&pFVar24->bcbase[BVar13].ins + 2) = (short)uVar10;
LAB_0011fc7a:
      bVar9 = true;
      goto LAB_0011fc81;
    }
LAB_0011f804:
    bVar9 = true;
LAB_0011fc81:
    if (ls->tok == 0x3b) {
      lj_lex_next(ls);
    }
    ls->fs->freereg = ls->fs->nactvar;
  } while (bVar9);
  ls->level = ls->level - 1;
  return;
}

Assistant:

static void parse_chunk(LexState *ls)
{
  int islast = 0;
  synlevel_begin(ls);
  while (!islast && !parse_isend(ls->tok)) {
    islast = parse_stmt(ls);
    lex_opt(ls, ';');
    lj_assertLS(ls->fs->framesize >= ls->fs->freereg &&
		ls->fs->freereg >= ls->fs->nactvar,
		"bad regalloc");
    ls->fs->freereg = ls->fs->nactvar;  /* Free registers after each stmt. */
  }
  synlevel_end(ls);
}